

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obstacle.cpp
# Opt level: O0

Obstacle * __thiscall Obstacle::operator=(Obstacle *this,Obstacle *src)

{
  Obstacle *src_local;
  Obstacle *this_local;
  
  if (this != src) {
    this->_xpos = src->_xpos;
    this->_ypos = src->_ypos;
    this->_delay = src->_delay;
    this->_active = (bool)(src->_active & 1);
    this->_speed = src->_speed;
    this->_limit = src->_limit;
    std::__cxx11::string::operator=((string *)&this->_axis,(string *)&src->_axis);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::operator=
              (&this->_cars,&src->_cars);
    src->_xpos = 0;
    src->_ypos = 0;
    src->_delay = 0;
    src->_active = false;
    src->_speed = 0;
    src->_limit = 0;
    std::__cxx11::string::operator=((string *)&src->_axis,"");
  }
  return this;
}

Assistant:

Obstacle& Obstacle::operator=(Obstacle&& src){
        if(this != &src){
            _xpos = src._xpos;
            _ypos = src._ypos;
            _delay = src._delay;
            _active = src._active;
            _speed = src._speed;
            _limit = src._limit;
            _axis = src._axis;
            _cars = src._cars;
        
        //default the value of the src object
            src._xpos = 0;
            src._ypos = 0;
            src._delay = 0;
            src._active = false;
            src._speed = 0;
            src._limit = 0;
            src._axis = "";
            //src._cars.
        }

        return *this;
    }